

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

void __thiscall capnp::DynamicValue::Reader::Reader(Reader *this,ConstSchema constant)

{
  PointerReader reader;
  undefined8 uVar1;
  byte bVar2;
  ElementSize expectedElementSize;
  Which WVar3;
  StructSchema schema;
  undefined2 uVar4;
  SegmentReader *pSVar5;
  anon_union_8_2_eba6ea51_for_Type_5 aVar6;
  SegmentReader *pSVar7;
  ListSchema LVar8;
  Fault f;
  Reader value;
  Type type;
  undefined1 local_130 [8];
  undefined1 local_128 [24];
  StructDataBitCount SStack_110;
  undefined2 uStack_10c;
  undefined4 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  StructReader local_e8;
  StructDataBitCount local_b4;
  Type local_b0;
  anon_union_8_2_eba6ea51_for_Type_5 local_a0;
  undefined1 local_98 [24];
  StructDataBitCount SStack_80;
  undefined4 uStack_7c;
  byte *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Schema local_58;
  PointerReader local_50;
  
  this->type = VOID;
  local_58 = constant.super_Schema.raw;
  local_b0 = ConstSchema::getType((ConstSchema *)&local_58);
  Schema::getProto((Reader *)local_130,&local_58);
  if ((ushort)uStack_10c < 5) {
    SStack_80 = 0x7fffffff;
    local_98._8_8_ = (RawBrandedSchema *)0x0;
    local_98._16_8_ = (SegmentReader *)0x0;
    local_98._0_8_ = (SegmentReader *)0x0;
  }
  else {
    local_98._0_8_ = CONCAT44(local_130._4_4_,local_130._0_4_);
    local_98._16_8_ = local_128._16_8_ + 0x20;
    local_98._8_8_ = local_128._0_8_;
    SStack_80 = local_108;
  }
  capnp::_::PointerReader::getStruct(&local_e8,(PointerReader *)local_98,(word *)0x0);
  WVar3 = LIST;
  if (local_b0.listDepth == '\0') {
    WVar3 = local_b0.baseType;
  }
  switch(WVar3) {
  case VOID:
    local_130._0_4_ = VOID;
    operator=(this,(Reader *)local_130);
    break;
  case BOOL:
    if (local_e8.dataSize < 0x11) {
      bVar2 = 0;
    }
    else {
      bVar2 = *(byte *)((long)local_e8.data + 2) & 1;
    }
    local_130._0_4_ = BOOL;
    local_128[0] = bVar2;
    operator=(this,(Reader *)local_130);
    break;
  case INT8:
    if (local_e8.dataSize < 0x18) {
      local_128._0_8_ = (char *)0x0;
    }
    else {
      local_128._0_8_ = SEXT18(*(char *)((long)local_e8.data + 2));
    }
    local_130._0_4_ = INT;
    operator=(this,(Reader *)local_130);
    break;
  case INT16:
    if (local_e8.dataSize < 0x20) {
      local_128._0_8_ = (char *)0x0;
    }
    else {
      local_128._0_8_ = SEXT28(*(short *)((long)local_e8.data + 2));
    }
    local_130._0_4_ = INT;
    operator=(this,(Reader *)local_130);
    break;
  case INT32:
    if (local_e8.dataSize < 0x40) {
      local_128._0_8_ = (char *)0x0;
    }
    else {
      local_128._0_8_ = SEXT48(*(int *)((long)local_e8.data + 4));
    }
    local_130._0_4_ = INT;
    operator=(this,(Reader *)local_130);
    break;
  case INT64:
    if (local_e8.dataSize < 0x80) {
      local_128._0_8_ = (char *)0x0;
    }
    else {
      local_128._0_8_ = *(undefined8 *)((long)local_e8.data + 8);
    }
    local_130._0_4_ = INT;
    operator=(this,(Reader *)local_130);
    break;
  case UINT8:
    if (local_e8.dataSize < 0x18) {
      local_128._0_8_ = (char *)0x0;
    }
    else {
      local_128._0_8_ = ZEXT18(*(byte *)((long)local_e8.data + 2));
    }
    local_130._0_4_ = UINT;
    operator=(this,(Reader *)local_130);
    break;
  case UINT16:
    if (local_e8.dataSize < 0x20) {
      local_128._0_8_ = (char *)0x0;
    }
    else {
      local_128._0_8_ = ZEXT28(*(ushort *)((long)local_e8.data + 2));
    }
    local_130._0_4_ = UINT;
    operator=(this,(Reader *)local_130);
    break;
  case UINT32:
    if (local_e8.dataSize < 0x40) {
      local_128._0_8_ = (char *)0x0;
    }
    else {
      local_128._0_8_ = ZEXT48(*(uint *)((long)local_e8.data + 4));
    }
    local_130._0_4_ = UINT;
    operator=(this,(Reader *)local_130);
    break;
  case UINT64:
    if (local_e8.dataSize < 0x80) {
      local_128._0_8_ = (char *)0x0;
    }
    else {
      local_128._0_8_ = *(undefined8 *)((long)local_e8.data + 8);
    }
    local_130._0_4_ = UINT;
    operator=(this,(Reader *)local_130);
    break;
  case FLOAT32:
    local_128._0_8_ = (char *)0x0;
    if (0x3f < local_e8.dataSize) {
      local_128._0_8_ = (undefined8)*(float *)((long)local_e8.data + 4);
    }
    local_130._0_4_ = FLOAT;
    operator=(this,(Reader *)local_130);
    break;
  case FLOAT64:
    local_128._0_4_ = 0;
    local_128._4_4_ = 0;
    if (0x7f < local_e8.dataSize) {
      local_128._0_4_ = (undefined4)*(undefined8 *)((long)local_e8.data + 8);
      local_128._4_4_ = (undefined4)((ulong)*(undefined8 *)((long)local_e8.data + 8) >> 0x20);
    }
    local_130._0_4_ = FLOAT;
    operator=(this,(Reader *)local_130);
    break;
  case TEXT:
    if (local_e8.pointerCount == 0) {
      local_e8.nestingLimit = 0x7fffffff;
      local_e8.capTable = (CapTableReader *)0x0;
      local_e8.pointers = (WirePointer *)0x0;
      local_e8.segment = (SegmentReader *)0x0;
    }
    local_98._0_8_ = local_e8.segment;
    local_98._8_8_ = local_e8.capTable;
    local_98._16_8_ = local_e8.pointers;
    SStack_80 = local_e8.nestingLimit;
    local_128._0_16_ =
         (undefined1  [16])
         capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_98,(void *)0x0,0);
    local_130._0_4_ = TEXT;
    operator=(this,(Reader *)local_130);
    break;
  case DATA:
    if (local_e8.pointerCount == 0) {
      local_e8.nestingLimit = 0x7fffffff;
      local_e8.capTable = (CapTableReader *)0x0;
      local_e8.pointers = (WirePointer *)0x0;
      local_e8.segment = (SegmentReader *)0x0;
    }
    local_98._0_8_ = local_e8.segment;
    local_98._8_8_ = local_e8.capTable;
    local_98._16_8_ = local_e8.pointers;
    SStack_80 = local_e8.nestingLimit;
    local_128._0_16_ =
         (undefined1  [16])
         capnp::_::PointerReader::getBlob<capnp::Data>((PointerReader *)local_98,(void *)0x0,0);
    local_130._0_4_ = DATA;
    operator=(this,(Reader *)local_130);
    break;
  case LIST:
    if (local_e8.pointerCount == 0) {
      local_b4 = 0x7fffffff;
      aVar6.schema = (RawBrandedSchema *)0x0;
      pSVar7 = (SegmentReader *)0x0;
      pSVar5 = (SegmentReader *)0x0;
    }
    else {
      local_b4 = local_e8.nestingLimit;
      pSVar5 = local_e8.segment;
      aVar6 = (anon_union_8_2_eba6ea51_for_Type_5)local_e8.capTable;
      pSVar7 = (SegmentReader *)local_e8.pointers;
    }
    LVar8 = Type::asList(&local_b0);
    local_a0 = LVar8.elementType.field_4;
    local_50.nestingLimit = local_b4;
    WVar3 = LIST;
    if (((undefined1  [16])LVar8.elementType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0)
    {
      WVar3 = LVar8.elementType.baseType;
    }
    local_50.segment = pSVar5;
    local_50.capTable = (CapTableReader *)aVar6;
    local_50.pointer = (WirePointer *)pSVar7;
    expectedElementSize = anon_unknown_71::elementSizeFor(WVar3);
    capnp::_::PointerReader::getList
              ((ListReader *)(local_98 + 0x10),&local_50,expectedElementSize,(word *)0x0);
    local_98._8_8_ = local_a0;
    local_130._0_4_ = LIST;
    _SStack_110 = CONCAT44(uStack_7c,SStack_80);
    local_128._16_8_ = local_98._16_8_;
    _local_108 = local_78;
    uStack_100 = uStack_70;
    local_f8 = local_68;
    uStack_f0 = uStack_60;
    local_128._8_8_ = local_a0.schema;
    local_128._0_8_ = LVar8.elementType._0_8_;
    local_98._0_8_ = LVar8.elementType._0_8_;
    operator=(this,(Reader *)local_130);
    break;
  case ENUM:
    local_128._0_8_ = Type::asEnum(&local_b0);
    if (local_e8.dataSize < 0x20) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(undefined2 *)((long)local_e8.data + 2);
    }
    local_130._0_4_ = ENUM;
    local_128._8_2_ = uVar4;
    operator=(this,(Reader *)local_130);
    break;
  case STRUCT:
    if (local_e8.pointerCount == 0) {
      local_e8.nestingLimit = 0x7fffffff;
      local_e8.capTable = (CapTableReader *)0x0;
      local_e8.pointers = (WirePointer *)0x0;
      local_e8.segment = (SegmentReader *)0x0;
    }
    local_98._0_8_ = local_e8.segment;
    local_98._8_8_ = local_e8.capTable;
    local_98._16_8_ = local_e8.pointers;
    SStack_80 = local_e8.nestingLimit;
    schema = Type::asStruct(&local_b0);
    reader._28_4_ = uStack_7c;
    reader.nestingLimit = SStack_80;
    reader.capTable = (CapTableReader *)local_98._8_8_;
    reader.segment = (SegmentReader *)local_98._0_8_;
    reader.pointer = (WirePointer *)local_98._16_8_;
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
              ((Reader *)local_128,reader,schema);
    local_130._0_4_ = STRUCT;
    operator=(this,(Reader *)local_130);
    break;
  case INTERFACE:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              ((Fault *)local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x5bc,FAILED,(char *)0x0,"\"Constants can\'t have interface type.\"",
               (char (*) [37])"Constants can\'t have interface type.");
    kj::_::Debug::Fault::fatal((Fault *)local_130);
  case ANY_POINTER:
    if (local_e8.pointerCount == 0) {
      local_e8.nestingLimit = 0x7fffffff;
      local_e8.capTable = (CapTableReader *)0x0;
      local_e8.pointers = (WirePointer *)0x0;
      local_e8.segment = (SegmentReader *)0x0;
    }
    local_130._0_4_ = ANY_POINTER;
    local_128._8_8_ = local_e8.capTable;
    local_128._0_8_ = local_e8.segment;
    SStack_110 = local_e8.nestingLimit;
    local_128._16_8_ = local_e8.pointers;
    operator=(this,(Reader *)local_130);
    break;
  default:
    goto switchD_003a12b2_default;
  }
  if ((local_130._0_4_ == CAPABILITY) &&
     (uVar1 = local_128._8_8_, (ClientHook *)local_128._8_8_ != (ClientHook *)0x0)) {
    local_128._8_8_ = 0;
    (*(code *)(*(Arena **)local_128._0_8_)->_vptr_Arena)
              (local_128._0_8_,
               (_func_int *)((long)(Arena **)uVar1 + (long)(*(Arena **)uVar1)[-2]._vptr_Arena));
  }
switchD_003a12b2_default:
  return;
}

Assistant:

DynamicValue::Reader::Reader(ConstSchema constant): type(VOID) {
  auto type = constant.getType();
  auto value = constant.getProto().getConst().getValue();
  switch (type.which()) {
    case schema::Type::VOID: *this = capnp::VOID; break;
    case schema::Type::BOOL: *this = value.getBool(); break;
    case schema::Type::INT8: *this = value.getInt8(); break;
    case schema::Type::INT16: *this = value.getInt16(); break;
    case schema::Type::INT32: *this = value.getInt32(); break;
    case schema::Type::INT64: *this = value.getInt64(); break;
    case schema::Type::UINT8: *this = value.getUint8(); break;
    case schema::Type::UINT16: *this = value.getUint16(); break;
    case schema::Type::UINT32: *this = value.getUint32(); break;
    case schema::Type::UINT64: *this = value.getUint64(); break;
    case schema::Type::FLOAT32: *this = value.getFloat32(); break;
    case schema::Type::FLOAT64: *this = value.getFloat64(); break;
    case schema::Type::TEXT: *this = value.getText(); break;
    case schema::Type::DATA: *this = value.getData(); break;

    case schema::Type::ENUM:
      *this = DynamicEnum(type.asEnum(), value.getEnum());
      break;

    case schema::Type::STRUCT:
      *this = value.getStruct().getAs<DynamicStruct>(type.asStruct());
      break;

    case schema::Type::LIST:
      *this = value.getList().getAs<DynamicList>(type.asList());
      break;

    case schema::Type::ANY_POINTER:
      *this = value.getAnyPointer();
      break;

    case schema::Type::INTERFACE:
      KJ_FAIL_ASSERT("Constants can't have interface type.");
  }
}